

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

int is_swizzle_str(char *str,int veclen)

{
  int iVar1;
  byte *pbVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  bool bVar6;
  
  if (*str == '\0') {
    __assert_fail("*str != \'\\0\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0x8c6,"int is_swizzle_str(const char *, const int)");
  }
  iVar1 = 0;
  bVar6 = false;
  if (0 < veclen) {
    pbVar2 = (byte *)(str + (uint)veclen);
    iVar3 = 0;
    pbVar4 = (byte *)str;
    do {
      uVar5 = *pbVar4 - 0x61;
      if (uVar5 < 0x1a) {
        if ((0x20043U >> (uVar5 & 0x1f) & 1) == 0) {
          if ((0x3c00000U >> (uVar5 & 0x1f) & 1) == 0) goto LAB_00144801;
          bVar6 = true;
          iVar3 = 1;
        }
        else {
          bVar6 = true;
          iVar1 = 1;
        }
      }
      else {
LAB_00144801:
        if (*pbVar4 == 0) {
          bVar6 = false;
        }
        else {
          bVar6 = true;
        }
      }
      str = (char *)pbVar4;
      if (!bVar6) break;
      pbVar4 = pbVar4 + 1;
      veclen = veclen + -1;
      str = (char *)pbVar2;
    } while (veclen != 0);
    bVar6 = iVar1 + iVar3 == 1;
  }
  return (int)(byte)(*str == 0U & bVar6);
}

Assistant:

static int is_swizzle_str(const char *str, const int veclen)
{
    int i;
    int is_xyzw = 0;
    int is_rgba = 0;

    assert(*str != '\0');  // can this actually happen?

    for (i = 0; i < veclen; i++, str++)
    {
        const char ch = *str;
        if (ch == '\0')
            break;
        else if ((ch == 'x') || (ch == 'y') || (ch == 'z') || (ch == 'w'))
            is_xyzw = 1;
        else if ((ch == 'r') || (ch == 'g') || (ch == 'b') || (ch == 'a'))
            is_rgba = 1;
    } // for

    if (*str != '\0')  // must be end of string here.
        return 0;  // not a swizzle.
    return ((is_rgba + is_xyzw) == 1);  // can only be one or the other.
}